

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x81d750;
  *(undefined8 *)&this->field_0x190 = 0x81d890;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x81d778;
  (this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x81d7a0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x81d7c8;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x81d7f0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x138
       = 0x81d818;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x148
       = 0x81d840;
  *(undefined8 *)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 =
       0x81d868;
  puVar1 = *(undefined1 **)&(this->super_IfcBuildingElementComponent).field_0x168;
  if (puVar1 != &this->field_0x178) {
    operator_delete(puVar1,*(long *)&this->field_0x178 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0081d8b8);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}